

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dirscanner_nix.cpp
# Opt level: O2

int test_dirscan_scan(ITesting *t)

{
  kTRContinueMode kVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  int iVar2;
  allocator<char> local_81;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  string local_68;
  DirScanner scanner;
  
  trun::DirScanner::DirScanner(&scanner);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"lib/",&local_81);
  __x = trun::DirScanner::Scan(&scanner,&local_68,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&res,__x);
  std::__cxx11::string::~string((string *)&local_68);
  if (res.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      res.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    kVar1 = (*t->AssertError)(0x19,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_dirscanner_nix.cpp"
                              ,"res.size() > 0");
    if (kVar1 == kTRLeave) {
      iVar2 = 0x10;
      goto LAB_00187124;
    }
  }
  iVar2 = 0;
LAB_00187124:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&res);
  trun::DirScanner::~DirScanner(&scanner);
  return iVar2;
}

Assistant:

DLL_EXPORT int test_dirscan_scan(ITesting *t) {
    DirScanner scanner;

    // Scanner is searching for dylibs - we need to look in the lib folder when not recursing...
    auto res = scanner.Scan("lib/", false);
    TR_ASSERT(t, res.size() > 0);

    return kTR_Pass;
}